

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O0

void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *ctx,int start,char chr,int end)

{
  jsparser_ctx *js_00;
  char cVar1;
  int iVar2;
  int local_4c;
  char local_48 [4];
  int pos;
  char buffer [18];
  jsparser_ctx *js;
  int end_local;
  char chr_local;
  int start_local;
  statemachine_ctx *ctx_local;
  
  if (ctx == (statemachine_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x1c3,
                  "void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *, int, char, int)"
                 );
  }
  if (ctx->user != (void *)0x0) {
    js_00 = (jsparser_ctx *)ctx->user;
    if (js_00 != (jsparser_ctx *)0x0) {
      local_4c = -1;
      cVar1 = jsparser_buffer_get(js_00,-1);
      iVar2 = js_is_whitespace(cVar1);
      if (iVar2 != 0) {
        local_4c = -2;
      }
      cVar1 = jsparser_buffer_get(js_00,local_4c);
      switch(cVar1) {
      case '\0':
      case '!':
      case '%':
      case '&':
      case '(':
      case '*':
      case ',':
      case '/':
      case ':':
      case ';':
      case '<':
      case '=':
      case '>':
      case '?':
      case '[':
      case '^':
      case '{':
      case '|':
      case '}':
      case '~':
        ctx->next_state = 6;
        break;
      default:
        iVar2 = jsparser_buffer_last_identifier(js_00,local_48);
        if ((iVar2 != 0) && (iVar2 = is_regexp_token_prefix(local_48), iVar2 != 0)) {
          ctx->next_state = 6;
        }
        break;
      case '+':
        cVar1 = jsparser_buffer_get(js_00,local_4c + -1);
        if (cVar1 != '+') {
          ctx->next_state = 6;
        }
        break;
      case '-':
        cVar1 = jsparser_buffer_get(js_00,local_4c + -1);
        if (cVar1 != '-') {
          ctx->next_state = 6;
        }
      }
      jsparser_buffer_append_chr(js_00,chr);
      return;
    }
    __assert_fail("js != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x1c7,
                  "void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *, int, char, int)"
                 );
  }
  __assert_fail("ctx->user != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,0x1c4,
                "void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *, int, char, int)"
               );
}

Assistant:

static void enter_state_js_slash(statemachine_ctx *ctx, int start, char chr,
                                 int end)
{
  jsparser_ctx *js;
  char buffer[JSPARSER_RING_BUFFER_SIZE];
  int pos;

  assert(ctx != NULL);
  assert(ctx->user != NULL);

  js = CAST(jsparser_ctx *, ctx->user);
  assert(js != NULL);

  pos = -1;
  /* Consume the last whitespace. */
  if (js_is_whitespace(jsparser_buffer_get(js, pos))) {
    --pos;
  }

  switch (jsparser_buffer_get(js, pos)) {
    /* Ignore unary increment */
    case '+':
      if (jsparser_buffer_get(js, pos - 1) != '+') {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
      break;

    /* Ignore unary decrement */
    case '-':
      if (jsparser_buffer_get(js, pos - 1) != '-') {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
      break;

    /* List of punctuator endings except ), ], }, + and - */
    case '=':
    case '<':
    case '>':
    case '&':
    case '|':
    case '!':
    case '%':
    case '*':
    case '/':
    case ',':
    case ';':
    case '?':
    case ':':
    case '^':
    case '~':
    case '{':
    case '(':
    case '[':
    case '}':
    case '\0':
      ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      break;

    default:
      if (jsparser_buffer_last_identifier(js, buffer) &&
          is_regexp_token_prefix(buffer)) {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
  }

  jsparser_buffer_append_chr(js, chr);
}